

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_to_revision.cpp
# Opt level: O3

maybe<unsigned_int,_void> *
pstore::str_to_revision(maybe<unsigned_int,_void> *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  byte *pbVar8;
  string arg;
  char *endptr;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  
  pbVar6 = (byte *)(str->_M_dataplus)._M_p;
  uVar7 = str->_M_string_length;
  pbVar5 = pbVar6 + uVar7;
  lVar4 = (long)uVar7 >> 2;
  pbVar3 = pbVar5;
  if (0 < lVar4) {
    pbVar3 = pbVar5 + -(uVar7 & 0xfffffffffffffffc);
    pbVar5 = pbVar5 + lVar4 * -4;
    lVar4 = lVar4 + 1;
    do {
      iVar2 = isspace((uint)pbVar6[uVar7 - 1]);
      if (iVar2 == 0) {
        pbVar8 = pbVar6 + uVar7;
        goto LAB_00179eb9;
      }
      iVar2 = isspace((uint)pbVar6[uVar7 - 2]);
      if (iVar2 == 0) {
        pbVar8 = pbVar6 + (uVar7 - 1);
        goto LAB_00179eb9;
      }
      iVar2 = isspace((uint)pbVar6[uVar7 - 3]);
      if (iVar2 == 0) {
        pbVar8 = pbVar6 + (uVar7 - 2);
        goto LAB_00179eb9;
      }
      iVar2 = isspace((uint)pbVar6[uVar7 - 4]);
      if (iVar2 == 0) {
        pbVar8 = pbVar6 + (uVar7 - 3);
        goto LAB_00179eb9;
      }
      uVar7 = uVar7 - 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)pbVar3 - (long)pbVar6;
  if (lVar4 == 1) {
LAB_00179e82:
    iVar2 = isspace((uint)pbVar3[-1]);
    pbVar8 = pbVar3;
    if (iVar2 != 0) {
      pbVar8 = pbVar6;
    }
  }
  else if (lVar4 == 2) {
LAB_00179e6b:
    iVar2 = isspace((uint)pbVar3[-1]);
    pbVar8 = pbVar3;
    if (iVar2 != 0) {
      pbVar3 = pbVar5 + -1;
      goto LAB_00179e82;
    }
  }
  else {
    pbVar8 = pbVar6;
    if ((lVar4 == 3) && (iVar2 = isspace((uint)pbVar3[-1]), pbVar8 = pbVar3, iVar2 != 0)) {
      pbVar5 = pbVar5 + -1;
      pbVar3 = pbVar5;
      goto LAB_00179e6b;
    }
  }
LAB_00179eb9:
  lVar4 = (long)pbVar8 - (long)pbVar6 >> 2;
  pbVar5 = pbVar6;
  if (0 < lVar4) {
    pbVar5 = pbVar6 + ((long)pbVar8 - (long)pbVar6 & 0xfffffffffffffffc);
    lVar4 = lVar4 + 1;
    pbVar6 = pbVar6 + 3;
    do {
      iVar2 = isspace((uint)pbVar6[-3]);
      if (iVar2 == 0) {
        pbVar6 = pbVar6 + -3;
        goto LAB_00179f8d;
      }
      iVar2 = isspace((uint)pbVar6[-2]);
      if (iVar2 == 0) {
        pbVar6 = pbVar6 + -2;
        goto LAB_00179f8d;
      }
      iVar2 = isspace((uint)pbVar6[-1]);
      if (iVar2 == 0) {
        pbVar6 = pbVar6 + -1;
        goto LAB_00179f8d;
      }
      iVar2 = isspace((uint)*pbVar6);
      if (iVar2 == 0) goto LAB_00179f8d;
      lVar4 = lVar4 + -1;
      pbVar6 = pbVar6 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)pbVar8 - (long)pbVar5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pbVar6 = pbVar8;
      if ((lVar4 != 3) || (iVar2 = isspace((uint)*pbVar5), pbVar6 = pbVar5, iVar2 == 0))
      goto LAB_00179f8d;
      pbVar5 = pbVar5 + 1;
    }
    iVar2 = isspace((uint)*pbVar5);
    pbVar6 = pbVar5;
    if (iVar2 == 0) goto LAB_00179f8d;
    pbVar5 = pbVar5 + 1;
  }
  iVar2 = isspace((uint)*pbVar5);
  pbVar6 = pbVar5;
  if (iVar2 != 0) {
    pbVar6 = pbVar8;
  }
LAB_00179f8d:
  local_50 = 0;
  local_48 = '\0';
  local_58 = &local_48;
  unsigned_cast<long,unsigned_long,void>((long)pbVar8 - (long)pbVar6);
  std::__cxx11::string::reserve((ulong)&local_58);
  if (pbVar6 != pbVar8) {
    do {
      tolower((int)(char)*pbVar6);
      std::__cxx11::string::push_back((char)&local_58);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar8);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  pcVar1 = local_58;
  if (iVar2 == 0) {
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = (type)0xffffffff;
  }
  else {
    local_38 = (char *)0x0;
    uVar7 = strtol(local_58,&local_38,10);
    if ((local_38 == pcVar1) || (0xfffffffe < uVar7 || *local_38 != '\0')) {
      __return_storage_ptr__->valid_ = false;
      *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
      __return_storage_ptr__->storage_ = (type)0x0;
    }
    else {
      __return_storage_ptr__->valid_ = true;
      __return_storage_ptr__->storage_ = SUB84(uVar7,0);
    }
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<unsigned> str_to_revision (std::string const & str) {
        std::string const arg = trim_and_lowercase (str);
        if (arg == "head") {
            return just (head_revision);
        }

        gsl::czstring const cstr = arg.c_str ();
        char * endptr = nullptr;
        long const revision = std::strtol (cstr, &endptr, 10);

        // strtol() returns LONG_MAX or LONG_MIN to indicate an overflow. endptr must point to
        // the terminating null character to ensure that the entire string was consumed. We also
        // check that revision lies within the range of numbers that we can safely represent.
        if (endptr != cstr && *endptr == '\0' && revision != LONG_MAX && revision != LONG_MIN &&
            revision >= 0 && revision != head_revision &&
            static_cast<unsigned long> (revision) < std::numeric_limits<unsigned>::max ()) {

            return just (static_cast<unsigned> (revision));
        }

        return nothing<unsigned> ();
    }